

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::ConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter> *this,int info)

{
  int num_items;
  int iVar1;
  int iVar2;
  IntSuffixHandler suffix_handler;
  DblSuffixHandler suffix_handler_1;
  
  iVar2 = *(int *)(*(long *)(this + 8) + 4);
  iVar1 = *(int *)(*(long *)(this + 8) + 0x14);
  num_items = iVar1 + iVar2;
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,1,
                     iVar1 + 1 + iVar2);
  TextReader<fmt::Locale>::ReadName(*(TextReader<fmt::Locale> **)this);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if ((info & 4U) == 0) {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::IntReader,mp::NLHandler<mp::NullNLHandler<int>,int>::IntSuffixHandler>
              (this,iVar2,num_items,&suffix_handler);
  }
  else {
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::DoubleReader,mp::NLHandler<mp::NullNLHandler<int>,int>::DblSuffixHandler>
              (this,iVar2,num_items,&suffix_handler_1);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}